

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O0

c_int osqp_solve(OSQPWorkspace *work)

{
  long lVar1;
  int iVar2;
  c_int cVar3;
  c_int cVar4;
  OSQPWorkspace *in_RDI;
  c_float cVar5;
  double dVar6;
  OSQPWorkspace *unaff_retaddr;
  c_int can_print;
  c_float temp_run_time;
  c_int can_check_termination;
  c_int compute_cost_function;
  c_int iter;
  c_int exitflag;
  char *in_stack_ffffffffffffff88;
  OSQPWorkspace *in_stack_ffffffffffffff90;
  c_float *in_stack_ffffffffffffff98;
  OSQPWorkspace *in_stack_ffffffffffffffa0;
  bool local_53;
  bool local_52;
  bool local_51;
  OSQPWorkspace *in_stack_ffffffffffffffb8;
  double in_stack_ffffffffffffffc8;
  OSQPWorkspace *work_00;
  long approximate;
  OSQPWorkspace *local_8;
  
  if (in_RDI == (OSQPWorkspace *)0x0) {
    local_8 = (OSQPWorkspace *)
              _osqp_error((osqp_error_type)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                          in_stack_ffffffffffffff88);
  }
  else {
    if (in_RDI->clear_update_time == 1) {
      in_RDI->info->update_time = 0.0;
    }
    in_RDI->rho_update_from_solve = 1;
    local_8 = (OSQPWorkspace *)0x0;
    work_00 = (OSQPWorkspace *)0x0;
    cVar3 = in_RDI->settings->verbose;
    lVar1 = in_RDI->settings->verbose;
    osqp_tic((OSQPTimer *)0x10a812);
    if (in_RDI->settings->verbose != 0) {
      print_header();
    }
    osqp_start_interrupt_listener();
    if (in_RDI->settings->warm_start == 0) {
      cold_start((OSQPWorkspace *)0x10a852);
    }
    for (approximate = 1; approximate <= in_RDI->settings->max_iter; approximate = approximate + 1)
    {
      swap_vectors(&in_RDI->x,&in_RDI->x_prev);
      swap_vectors(&in_RDI->z,&in_RDI->z_prev);
      update_xz_tilde((OSQPWorkspace *)0x10a8ae);
      update_x(in_RDI);
      update_z(in_stack_ffffffffffffff90);
      update_y(in_RDI);
      iVar2 = osqp_is_interrupted();
      if (iVar2 != 0) {
        update_status((OSQPInfo *)in_stack_ffffffffffffff90,(c_int)in_stack_ffffffffffffff88);
        printf("Solver interrupted\n");
        local_8 = (OSQPWorkspace *)0x1;
        goto LAB_0010b0cc;
      }
      if (in_RDI->first_run == 0) {
        in_stack_ffffffffffffffc8 = in_RDI->info->update_time;
        cVar5 = osqp_toc((OSQPTimer *)in_stack_ffffffffffffff90);
        in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + cVar5;
      }
      else {
        in_stack_ffffffffffffffb8 = (OSQPWorkspace *)in_RDI->info->setup_time;
        cVar5 = osqp_toc((OSQPTimer *)in_stack_ffffffffffffff90);
        in_stack_ffffffffffffffc8 = (double)in_stack_ffffffffffffffb8 + cVar5;
      }
      dVar6 = in_RDI->settings->time_limit;
      if (((dVar6 != 0.0) || (NAN(dVar6))) &&
         (in_RDI->settings->time_limit <= in_stack_ffffffffffffffc8)) {
        update_status((OSQPInfo *)in_stack_ffffffffffffff90,(c_int)in_stack_ffffffffffffff88);
        if (in_RDI->settings->verbose != 0) {
          printf("run time limit reached\n");
        }
        cVar3 = 0;
        break;
      }
      local_51 = false;
      if (in_RDI->settings->check_termination != 0) {
        local_51 = approximate % in_RDI->settings->check_termination == 0;
      }
      work_00 = (OSQPWorkspace *)(long)(int)(uint)local_51;
      local_52 = false;
      if (in_RDI->settings->verbose != 0) {
        local_53 = approximate % 200 == 0 || approximate == 1;
        local_52 = local_53;
      }
      cVar3 = (c_int)(int)(uint)local_52;
      if ((work_00 != (OSQPWorkspace *)0x0) || (cVar3 != 0)) {
        update_info(work_00,(c_int)in_stack_ffffffffffffffc8,cVar3,(c_int)in_stack_ffffffffffffffb8)
        ;
        if (cVar3 != 0) {
          print_summary(in_stack_ffffffffffffff90);
        }
        if ((work_00 != (OSQPWorkspace *)0x0) &&
           (cVar4 = check_termination(local_8,approximate), cVar4 != 0)) break;
      }
      if ((in_RDI->settings->adaptive_rho != 0) &&
         ((in_RDI->settings->adaptive_rho_interval == 0 &&
          (cVar5 = osqp_toc((OSQPTimer *)in_stack_ffffffffffffff90),
          in_RDI->settings->adaptive_rho_fraction * in_RDI->info->setup_time < cVar5)))) {
        if (in_RDI->settings->check_termination == 0) {
          in_stack_ffffffffffffff98 = (c_float *)((double)approximate + 12.5);
          dVar6 = fmod((double)approximate + 12.5,25.0);
          in_RDI->settings->adaptive_rho_interval =
               (long)((double)in_stack_ffffffffffffff98 - dVar6);
        }
        else {
          in_stack_ffffffffffffffa0 =
               (OSQPWorkspace *)
               ((double)in_RDI->settings->check_termination * 0.5 + (double)approximate);
          dVar6 = fmod((double)in_RDI->settings->check_termination * 0.5 + (double)approximate,
                       (double)in_RDI->settings->check_termination);
          in_RDI->settings->adaptive_rho_interval =
               (long)((double)in_stack_ffffffffffffffa0 - dVar6);
        }
        if (in_RDI->settings->check_termination < in_RDI->settings->adaptive_rho_interval) {
          in_stack_ffffffffffffff90 = (OSQPWorkspace *)in_RDI->settings->adaptive_rho_interval;
        }
        else {
          in_stack_ffffffffffffff90 = (OSQPWorkspace *)in_RDI->settings->check_termination;
        }
        in_RDI->settings->adaptive_rho_interval = (c_int)in_stack_ffffffffffffff90;
      }
      if (((in_RDI->settings->adaptive_rho != 0) && (in_RDI->settings->adaptive_rho_interval != 0))
         && (approximate % in_RDI->settings->adaptive_rho_interval == 0)) {
        if ((work_00 == (OSQPWorkspace *)0x0) && (cVar3 == 0)) {
          update_info((OSQPWorkspace *)0x0,(c_int)in_stack_ffffffffffffffc8,0,
                      (c_int)in_stack_ffffffffffffffb8);
        }
        cVar4 = adapt_rho(in_stack_ffffffffffffff90);
        if (cVar4 != 0) {
          printf("ERROR in %s: ","osqp_solve");
          printf("Failed rho update");
          printf("\n");
          local_8 = (OSQPWorkspace *)0x1;
          goto LAB_0010b0cc;
        }
      }
    }
    if (work_00 == (OSQPWorkspace *)0x0) {
      if (cVar3 == 0) {
        update_info((OSQPWorkspace *)0x0,(c_int)in_stack_ffffffffffffffc8,0,
                    (c_int)in_stack_ffffffffffffffb8);
      }
      if ((in_RDI->settings->verbose != 0) && (in_RDI->summary_printed == 0)) {
        print_summary(in_stack_ffffffffffffff90);
      }
      check_termination(local_8,approximate);
    }
    if ((lVar1 == 0) && (cVar3 = has_solution(in_RDI->info), cVar3 != 0)) {
      cVar5 = compute_obj_val(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      in_RDI->info->obj_val = cVar5;
    }
    if ((in_RDI->settings->verbose != 0) && (in_RDI->summary_printed == 0)) {
      print_summary(in_stack_ffffffffffffff90);
    }
    if ((in_RDI->info->status_val == -10) &&
       (cVar3 = check_termination(local_8,approximate), cVar3 == 0)) {
      update_status((OSQPInfo *)in_stack_ffffffffffffff90,(c_int)in_stack_ffffffffffffff88);
    }
    if ((in_RDI->info->status_val == -6) &&
       (cVar3 = check_termination(local_8,approximate), cVar3 == 0)) {
      update_status((OSQPInfo *)in_stack_ffffffffffffff90,(c_int)in_stack_ffffffffffffff88);
    }
    cVar5 = compute_rho_estimate(unaff_retaddr);
    in_RDI->info->rho_estimate = cVar5;
    cVar5 = osqp_toc((OSQPTimer *)in_stack_ffffffffffffff90);
    in_RDI->info->solve_time = cVar5;
    if ((in_RDI->settings->polish != 0) && (in_RDI->info->status_val == 1)) {
      polish(in_stack_ffffffffffffffb8);
    }
    if (in_RDI->first_run == 0) {
      in_RDI->info->run_time =
           in_RDI->info->update_time + in_RDI->info->solve_time + in_RDI->info->polish_time;
    }
    else {
      in_RDI->info->run_time =
           in_RDI->info->setup_time + in_RDI->info->solve_time + in_RDI->info->polish_time;
    }
    if (in_RDI->first_run != 0) {
      in_RDI->first_run = 0;
    }
    in_RDI->clear_update_time = 1;
    in_RDI->rho_update_from_solve = 0;
    if (in_RDI->settings->verbose != 0) {
      print_footer((OSQPInfo *)in_stack_ffffffffffffff90,(c_int)in_stack_ffffffffffffff88);
    }
    store_solution(in_stack_ffffffffffffff90);
LAB_0010b0cc:
    osqp_end_interrupt_listener();
  }
  return (c_int)local_8;
}

Assistant:

c_int osqp_solve(OSQPWorkspace *work) {

  c_int exitflag;
  c_int iter;
  c_int compute_cost_function; // Boolean: compute the cost function in the loop or not
  c_int can_check_termination; // Boolean: check termination or not

#ifdef PROFILING
  c_float temp_run_time;       // Temporary variable to store current run time
#endif /* ifdef PROFILING */

#ifdef PRINTING
  c_int can_print;             // Boolean whether you can print
#endif /* ifdef PRINTING */

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

#ifdef PROFILING
  if (work->clear_update_time == 1)
    work->info->update_time = 0.0;
  work->rho_update_from_solve = 1;
#endif /* ifdef PROFILING */

  // Initialize variables
  exitflag              = 0;
  can_check_termination = 0;
#ifdef PRINTING
  can_print = work->settings->verbose;
#endif /* ifdef PRINTING */
#ifdef PRINTING
  compute_cost_function = work->settings->verbose; // Compute cost function only
                                                   // if verbose is on
#else /* ifdef PRINTING */
  compute_cost_function = 0;                       // Never compute cost
                                                   // function during the
                                                   // iterations if no printing
                                                   // enabled
#endif /* ifdef PRINTING */



#ifdef PROFILING
  osqp_tic(work->timer); // Start timer
#endif /* ifdef PROFILING */


#ifdef PRINTING

  if (work->settings->verbose) {
    // Print Header for every column
    print_header();
  }
#endif /* ifdef PRINTING */

#ifdef CTRLC

  // initialize Ctrl-C support
  osqp_start_interrupt_listener();
#endif /* ifdef CTRLC */

  // Initialize variables (cold start or warm start depending on settings)
  if (!work->settings->warm_start) cold_start(work);  // If not warm start ->
                                                      // set x, z, y to zero

  // Main ADMM algorithm
  for (iter = 1; iter <= work->settings->max_iter; iter++) {
    // Update x_prev, z_prev (preallocated, no malloc)
    swap_vectors(&(work->x), &(work->x_prev));
    swap_vectors(&(work->z), &(work->z_prev));

    /* ADMM STEPS */
    /* Compute \tilde{x}^{k+1}, \tilde{z}^{k+1} */
    update_xz_tilde(work);

    /* Compute x^{k+1} */
    update_x(work);

    /* Compute z^{k+1} */
    update_z(work);

    /* Compute y^{k+1} */
    update_y(work);

    /* End of ADMM Steps */

#ifdef CTRLC

    // Check the interrupt signal
    if (osqp_is_interrupted()) {
      update_status(work->info, OSQP_SIGINT);
# ifdef PRINTING
      c_print("Solver interrupted\n");
# endif /* ifdef PRINTING */
      exitflag = 1;
      goto exit;
    }
#endif /* ifdef CTRLC */

#ifdef PROFILING

    // Check if solver time_limit is enabled. In case, check if the current
    // run time is more than the time_limit option.
    if (work->first_run) {
      temp_run_time = work->info->setup_time + osqp_toc(work->timer);
    }
    else {
      temp_run_time = work->info->update_time + osqp_toc(work->timer);
    }

    if (work->settings->time_limit &&
        (temp_run_time >= work->settings->time_limit)) {
      update_status(work->info, OSQP_TIME_LIMIT_REACHED);
# ifdef PRINTING
      if (work->settings->verbose) c_print("run time limit reached\n");
      can_print = 0;  // Not printing at this iteration
# endif /* ifdef PRINTING */
      break;
    }
#endif /* ifdef PROFILING */


    // Can we check for termination ?
    can_check_termination = work->settings->check_termination &&
                            (iter % work->settings->check_termination == 0);

#ifdef PRINTING

    // Can we print ?
    can_print = work->settings->verbose &&
                ((iter % PRINT_INTERVAL == 0) || (iter == 1));

    if (can_check_termination || can_print) { // Update status in either of
                                              // these cases
      // Update information
      update_info(work, iter, compute_cost_function, 0);

      if (can_print) {
        // Print summary
        print_summary(work);
      }

      if (can_check_termination) {
        // Check algorithm termination
        if (check_termination(work, 0)) {
          // Terminate algorithm
          break;
        }
      }
    }
#else /* ifdef PRINTING */

    if (can_check_termination) {
      // Update information and compute also objective value
      update_info(work, iter, compute_cost_function, 0);

      // Check algorithm termination
      if (check_termination(work, 0)) {
        // Terminate algorithm
        break;
      }
    }
#endif /* ifdef PRINTING */


#if EMBEDDED != 1
# ifdef PROFILING

    // If adaptive rho with automatic interval, check if the solve time is a
    // certain fraction
    // of the setup time.
    if (work->settings->adaptive_rho && !work->settings->adaptive_rho_interval) {
      // Check time
      if (osqp_toc(work->timer) >
          work->settings->adaptive_rho_fraction * work->info->setup_time) {
        // Enough time has passed. We now get the number of iterations between
        // the updates.
        if (work->settings->check_termination) {
          // If check_termination is enabled, we round the number of iterations
          // between
          // rho updates to the closest multiple of check_termination
          work->settings->adaptive_rho_interval = (c_int)c_roundmultiple(iter,
                                                                         work->settings->check_termination);
        } else {
          // If check_termination is disabled, we round the number of iterations
          // between
          // updates to the closest multiple of the default check_termination
          // interval.
          work->settings->adaptive_rho_interval = (c_int)c_roundmultiple(iter,
                                                                         CHECK_TERMINATION);
        }

        // Make sure the interval is not 0 and at least check_termination times
        work->settings->adaptive_rho_interval = c_max(
          work->settings->adaptive_rho_interval,
          work->settings->check_termination);
      } // If time condition is met
    }   // If adaptive rho enabled and interval set to auto
# endif // PROFILING

    // Adapt rho
    if (work->settings->adaptive_rho &&
        work->settings->adaptive_rho_interval &&
        (iter % work->settings->adaptive_rho_interval == 0)) {
      // Update info with the residuals if it hasn't been done before
# ifdef PRINTING

      if (!can_check_termination && !can_print) {
        // Information has not been computed neither for termination or printing
        // reasons
        update_info(work, iter, compute_cost_function, 0);
      }
# else /* ifdef PRINTING */

      if (!can_check_termination) {
        // Information has not been computed before for termination check
        update_info(work, iter, compute_cost_function, 0);
      }
# endif /* ifdef PRINTING */

      // Actually update rho
      if (adapt_rho(work)) {
# ifdef PRINTING
        c_eprint("Failed rho update");
# endif // PRINTING
        exitflag = 1;
        goto exit;
      }
    }
#endif // EMBEDDED != 1

  }        // End of ADMM for loop


  // Update information and check termination condition if it hasn't been done
  // during last iteration (max_iter reached or check_termination disabled)
  if (!can_check_termination) {
    /* Update information */
#ifdef PRINTING

    if (!can_print) {
      // Update info only if it hasn't been updated before for printing
      // reasons
      update_info(work, iter - 1, compute_cost_function, 0);
    }
#else /* ifdef PRINTING */

    // If no printing is enabled, update info directly
    update_info(work, iter - 1, compute_cost_function, 0);
#endif /* ifdef PRINTING */

#ifdef PRINTING

    /* Print summary */
    if (work->settings->verbose && !work->summary_printed) print_summary(work);
#endif /* ifdef PRINTING */

    /* Check whether a termination criterion is triggered */
    check_termination(work, 0);
  }

  // Compute objective value in case it was not
  // computed during the iterations
  if (!compute_cost_function && has_solution(work->info)){
    work->info->obj_val = compute_obj_val(work, work->x);
  }


#ifdef PRINTING
  /* Print summary for last iteration */
  if (work->settings->verbose && !work->summary_printed) {
    print_summary(work);
  }
#endif /* ifdef PRINTING */

  /* if max iterations reached, change status accordingly */
  if (work->info->status_val == OSQP_UNSOLVED) {
    if (!check_termination(work, 1)) { // Try to check for approximate
      update_status(work->info, OSQP_MAX_ITER_REACHED);
    }
  }

#ifdef PROFILING
  /* if time-limit reached check termination and update status accordingly */
 if (work->info->status_val == OSQP_TIME_LIMIT_REACHED) {
    if (!check_termination(work, 1)) { // Try for approximate solutions
      update_status(work->info, OSQP_TIME_LIMIT_REACHED); /* Change update status back to OSQP_TIME_LIMIT_REACHED */
    }
  }
#endif /* ifdef PROFILING */


#if EMBEDDED != 1
  /* Update rho estimate */
  work->info->rho_estimate = compute_rho_estimate(work);
#endif /* if EMBEDDED != 1 */

  /* Update solve time */
#ifdef PROFILING
  work->info->solve_time = osqp_toc(work->timer);
#endif /* ifdef PROFILING */


#ifndef EMBEDDED
  // Polish the obtained solution
  if (work->settings->polish && (work->info->status_val == OSQP_SOLVED))
    polish(work);
#endif /* ifndef EMBEDDED */

#ifdef PROFILING
  /* Update total time */
  if (work->first_run) {
    // total time: setup + solve + polish
    work->info->run_time = work->info->setup_time +
                           work->info->solve_time +
                           work->info->polish_time;
  } else {
    // total time: update + solve + polish
    work->info->run_time = work->info->update_time +
                           work->info->solve_time +
                           work->info->polish_time;
  }

  // Indicate that the solve function has already been executed
  if (work->first_run) work->first_run = 0;

  // Indicate that the update_time should be set to zero
  work->clear_update_time = 1;

  // Indicate that osqp_update_rho is not called from osqp_solve
  work->rho_update_from_solve = 0;
#endif /* ifdef PROFILING */

#ifdef PRINTING
  /* Print final footer */
  if (work->settings->verbose) print_footer(work->info, work->settings->polish);
#endif /* ifdef PRINTING */

  // Store solution
  store_solution(work);


// Define exit flag for quitting function
#if defined(PROFILING) || defined(CTRLC) || EMBEDDED != 1
exit:
#endif /* if defined(PROFILING) || defined(CTRLC) || EMBEDDED != 1 */

#ifdef CTRLC
  // Restore previous signal handler
  osqp_end_interrupt_listener();
#endif /* ifdef CTRLC */

  return exitflag;
}